

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

yrmcds_error yrmcds_connect(yrmcds *c,char *node,uint16_t port)

{
  int iVar1;
  yrmcds_error yVar2;
  int *piVar3;
  char *pcVar4;
  int server_fd;
  int local_2c;
  
  if (c != (yrmcds *)0x0) {
    iVar1 = pthread_mutex_init((pthread_mutex_t *)&c->lock,(pthread_mutexattr_t *)0x0);
    if (iVar1 == 0) {
      yVar2 = connect_to_server(node,port,&local_2c);
      if (yVar2 == YRMCDS_OK) {
        c->sock = local_2c;
        c->serial = 0;
        c->compress_size = 0;
        pcVar4 = (char *)malloc(0x100000);
        c->recvbuf = pcVar4;
        if (pcVar4 == (char *)0x0) {
          close(local_2c);
          pthread_mutex_destroy((pthread_mutex_t *)&c->lock);
          yVar2 = YRMCDS_OUT_OF_MEMORY;
        }
        else {
          c->capacity = 0x100000;
          c->used = 0;
          c->last_size = 0;
          c->decompressed = (char *)0x0;
          c->invalid = 0;
          c->text_mode = 0;
          c->rserial = 0;
          yVar2 = YRMCDS_OK;
        }
      }
    }
    else {
      piVar3 = __errno_location();
      *piVar3 = iVar1;
      yVar2 = YRMCDS_SYSTEM_ERROR;
    }
    return yVar2;
  }
  return YRMCDS_BAD_ARGUMENT;
}

Assistant:

yrmcds_error yrmcds_connect(yrmcds* c, const char* node, uint16_t port) {
    if( c == NULL )
        return YRMCDS_BAD_ARGUMENT;
#ifndef LIBYRMCDS_NO_INTERNAL_LOCK
    int e = pthread_mutex_init(&(c->lock), NULL);
    if( e != 0 ) {
        errno = e;
        return YRMCDS_SYSTEM_ERROR;
    }
#endif // ! LIBYRMCDS_NO_INTERNAL_LOCK
    int server_fd;
    yrmcds_error err = connect_to_server(node, port, &server_fd);
    if( err != YRMCDS_OK )
        return err;
    c->sock = server_fd;
    c->serial = 0;
    c->compress_size = 0;
    c->recvbuf = (char*)malloc(1 << 20);
    if( c->recvbuf == NULL ) {
        close(server_fd);
#ifndef LIBYRMCDS_NO_INTERNAL_LOCK
        pthread_mutex_destroy(&(c->lock));
#endif
        return YRMCDS_OUT_OF_MEMORY;
    }
    c->capacity = 1 << 20;
    c->used = 0;
    c->last_size = 0;
    c->decompressed = NULL;
    c->invalid = 0;
    c->text_mode = 0;
    c->rserial = 0;
    return YRMCDS_OK;
}